

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O0

Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *pFForm,Kit_Sop_t *cSop,int nLits,Vec_Int_t *vMemory)

{
  uint **cResult;
  uint **vQuo;
  uint **vRem;
  int iVar1;
  Kit_Edge_t KVar2;
  Kit_Edge_t eEdge1;
  Kit_Edge_t eNodeAnd;
  Kit_Edge_t eNodeRem;
  Kit_Edge_t eNodeQuo;
  Kit_Edge_t eNodeDiv;
  Kit_Sop_t *cCom;
  Kit_Sop_t *cRem;
  Kit_Sop_t *cQuo;
  Kit_Sop_t *cDiv;
  Kit_Sop_t Com;
  Kit_Sop_t Rem;
  Kit_Sop_t Quo;
  Kit_Sop_t Div;
  Vec_Int_t *vMemory_local;
  int nLits_local;
  Kit_Sop_t *cSop_local;
  Kit_Graph_t *pFForm_local;
  
  cResult = &Quo.pCubes;
  vQuo = &Rem.pCubes;
  vRem = &Com.pCubes;
  iVar1 = Kit_SopCubeNum(cSop);
  if (iVar1 < 1) {
    __assert_fail("Kit_SopCubeNum(cSop) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitFactor.c"
                  ,0x73,"Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *, Kit_Sop_t *, int, Vec_Int_t *)"
                 );
  }
  iVar1 = Kit_SopDivisor((Kit_Sop_t *)cResult,cSop,nLits,vMemory);
  if (iVar1 == 0) {
    pFForm_local._4_4_ = Kit_SopFactorTrivial(pFForm,cSop,nLits);
  }
  else {
    Kit_SopDivideInternal(cSop,(Kit_Sop_t *)cResult,(Kit_Sop_t *)vQuo,(Kit_Sop_t *)vRem,vMemory);
    iVar1 = Kit_SopCubeNum((Kit_Sop_t *)vQuo);
    if (iVar1 < 1) {
      __assert_fail("Kit_SopCubeNum(cQuo) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitFactor.c"
                    ,0x7d,
                    "Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *, Kit_Sop_t *, int, Vec_Int_t *)");
    }
    iVar1 = Kit_SopCubeNum((Kit_Sop_t *)vQuo);
    if (iVar1 == 1) {
      pFForm_local._4_4_ = Kit_SopFactorLF_rec(pFForm,cSop,(Kit_Sop_t *)vQuo,nLits,vMemory);
    }
    else {
      Kit_SopMakeCubeFree((Kit_Sop_t *)vQuo);
      Kit_SopDivideInternal(cSop,(Kit_Sop_t *)vQuo,(Kit_Sop_t *)cResult,(Kit_Sop_t *)vRem,vMemory);
      iVar1 = Kit_SopIsCubeFree((Kit_Sop_t *)cResult);
      if (iVar1 == 0) {
        Kit_SopCommonCubeCover((Kit_Sop_t *)&cDiv,(Kit_Sop_t *)cResult,vMemory);
        pFForm_local._4_4_ = Kit_SopFactorLF_rec(pFForm,cSop,(Kit_Sop_t *)&cDiv,nLits,vMemory);
      }
      else {
        KVar2 = Kit_SopFactor_rec(pFForm,(Kit_Sop_t *)cResult,nLits,vMemory);
        eEdge1 = Kit_SopFactor_rec(pFForm,(Kit_Sop_t *)vQuo,nLits,vMemory);
        pFForm_local._4_4_ = Kit_GraphAddNodeAnd(pFForm,KVar2,eEdge1);
        iVar1 = Kit_SopCubeNum((Kit_Sop_t *)vRem);
        if (iVar1 != 0) {
          KVar2 = Kit_SopFactor_rec(pFForm,(Kit_Sop_t *)vRem,nLits,vMemory);
          pFForm_local._4_4_ = Kit_GraphAddNodeOr(pFForm,pFForm_local._4_4_,KVar2);
        }
      }
    }
  }
  return pFForm_local._4_4_;
}

Assistant:

Kit_Edge_t Kit_SopFactor_rec( Kit_Graph_t * pFForm, Kit_Sop_t * cSop, int nLits, Vec_Int_t * vMemory )
{
    Kit_Sop_t Div, Quo, Rem, Com;
    Kit_Sop_t * cDiv = &Div, * cQuo = &Quo, * cRem = &Rem, * cCom = &Com;
    Kit_Edge_t eNodeDiv, eNodeQuo, eNodeRem, eNodeAnd;

    // make sure the cover contains some cubes
    assert( Kit_SopCubeNum(cSop) > 0 );

    // get the divisor
    if ( !Kit_SopDivisor(cDiv, cSop, nLits, vMemory) )
        return Kit_SopFactorTrivial( pFForm, cSop, nLits );

    // divide the cover by the divisor
    Kit_SopDivideInternal( cSop, cDiv, cQuo, cRem, vMemory );

    // check the trivial case
    assert( Kit_SopCubeNum(cQuo) > 0 );
    if ( Kit_SopCubeNum(cQuo) == 1 )
        return Kit_SopFactorLF_rec( pFForm, cSop, cQuo, nLits, vMemory );

    // make the quotient cube ABC_FREE
    Kit_SopMakeCubeFree( cQuo );

    // divide the cover by the quotient
    Kit_SopDivideInternal( cSop, cQuo, cDiv, cRem, vMemory );

    // check the trivial case
    if ( Kit_SopIsCubeFree( cDiv ) )
    {
        eNodeDiv = Kit_SopFactor_rec( pFForm, cDiv, nLits, vMemory );
        eNodeQuo = Kit_SopFactor_rec( pFForm, cQuo, nLits, vMemory );
        eNodeAnd = Kit_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Kit_SopCubeNum(cRem) == 0 )
            return eNodeAnd;
        eNodeRem = Kit_SopFactor_rec( pFForm, cRem, nLits, vMemory );
        return Kit_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
    }

    // get the common cube
    Kit_SopCommonCubeCover( cCom, cDiv, vMemory );

    // solve the simple problem
    return Kit_SopFactorLF_rec( pFForm, cSop, cCom, nLits, vMemory );
}